

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConstExpr.cpp
# Opt level: O0

void TestConstExpr::ComparisonTestTU<signed_char,short>(void)

{
  int iVar1;
  
  if (ComparisonTestTU<signed_char,short>()::b1 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,short>()::b1);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_short>::b1 = LessThanTest<signed_char,short>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,short>()::b1);
    }
  }
  if (ComparisonTestTU<signed_char,short>()::b2 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,short>()::b2);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_short>::b2 = LessThanEqualTest<signed_char,short>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,short>()::b2);
    }
  }
  if (ComparisonTestTU<signed_char,short>()::b3 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,short>()::b3);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_short>::b3 = GreaterThanTest<signed_char,short>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,short>()::b3);
    }
  }
  if (ComparisonTestTU<signed_char,short>()::b4 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,short>()::b4);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_short>::b4 = GreaterThanEqualTest<signed_char,short>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,short>()::b4);
    }
  }
  if (ComparisonTestTU<signed_char,short>()::b5 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,short>()::b5);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_short>::b5 = EqualTest<signed_char,short>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,short>()::b5);
    }
  }
  if (ComparisonTestTU<signed_char,short>()::b6 == '\0') {
    iVar1 = __cxa_guard_acquire(&ComparisonTestTU<signed_char,short>()::b6);
    if (iVar1 != 0) {
      ComparisonTestTU<signed_char,_short>::b6 = NotEqualTest<signed_char,short>();
      __cxa_guard_release(&ComparisonTestTU<signed_char,short>()::b6);
    }
  }
  return;
}

Assistant:

void ComparisonTestTU()
	{
		static bool b1 = LessThanTest<T, U>();
		static bool b2 = LessThanEqualTest<T, U>();
		static bool b3 = GreaterThanTest<T, U>();
		static bool b4 = GreaterThanEqualTest<T, U>();
		static bool b5 = EqualTest<T, U>();
		static bool b6 = NotEqualTest<T, U>();
	}